

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O0

string * __thiscall
wabt::cat<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
          (string *__return_storage_ptr__,wabt *this,char (*args) [6],
          basic_string_view<char,_std::char_traits<char>_> *args_1,char (*args_2) [3])

{
  char (*args_local_2) [3];
  basic_string_view<char,_std::char_traits<char>_> *args_local_1;
  char (*args_local) [6];
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
            ((char (*) [6])this,(basic_string_view<char,_std::char_traits<char>_> *)args,
             (char (*) [3])args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
            (__return_storage_ptr__,(char (*) [6])this,
             (basic_string_view<char,_std::char_traits<char>_> *)args,(char (*) [3])args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}